

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddecoder.c
# Opt level: O1

int initSoundDecoder(Sound_Channels _channels,Sound_Driver _driver,char *file,char *_alsaDevice)

{
  int iVar1;
  char *pcVar2;
  char soundFile [513];
  char acStack_218 [512];
  undefined1 local_18;
  
  channels = 2 - (uint)(_channels == SOUND_CHANNELS_MONO);
  errorSoundDecoder._0_8_ = errorSoundDecoder._0_8_ & 0xffffffffffffff00;
  sound_channels = _channels;
  driver = _driver;
  if (_driver == DRIVER_ALSA) {
    pcVar2 = "default";
    if (_alsaDevice != (char *)0x0) {
      pcVar2 = _alsaDevice;
    }
    iVar1 = snd_pcm_open(&pcm,pcVar2,1,0);
    if (iVar1 < 0) {
      builtin_strncpy(errorSoundDecoder,"Can\'t open default capture device",0x22);
      return 0;
    }
    iVar1 = input_initialize(pcm,&buffer,&buffer_l,channels,errorSoundDecoder);
    if (iVar1 < 0) {
      return 0;
    }
  }
  else {
    if (_driver == DRIVER_PULSE) {
      pa_dev = pulseaudio_initialize((uchar)channels,(char *)0x0);
      if (pa_dev == (pa_simple *)0x0) {
        builtin_strncpy(errorSoundDecoder,"Can\'t initialize pulse audio",0x1d);
        pa_dev = (pa_simple *)0x0;
        return 0;
      }
    }
    else {
      if (_driver != DRIVER_FILE) goto LAB_00102c7c;
      strncpy(acStack_218,file,0x200);
      local_18 = 0;
      fp = (FILE *)fopen(acStack_218,"rb");
      if ((FILE *)fp == (FILE *)0x0) {
        builtin_strncpy(errorSoundDecoder,"Can\'t open raw file for read",0x1d);
        return 0;
      }
    }
    buffer_l = 0x3fc;
    buffer = (short *)hmalloc((ulong)(uint)channels * 0x7f8);
  }
LAB_00102c7c:
  if (sound_channels == SOUND_CHANNELS_MONO) {
    rx_a = init_receiver('A',1,0);
  }
  else {
    rx_a = init_receiver('A',2,0);
    rx_b = init_receiver('B',2,1);
  }
  return 1;
}

Assistant:

int initSoundDecoder(const Sound_Channels _channels, const Sound_Driver _driver, const char *file, unsigned int deviceId) {
#endif
    sound_channels = _channels;
    driver = _driver;
    channels = sound_channels == SOUND_CHANNELS_MONO ? 1 : 2;
    errorSoundDecoder[0]=0;
    char soundFile[MAX_FILENAME_SIZE+1];
    switch (driver) {
    case DRIVER_FILE:
        strncpy(soundFile, file, MAX_FILENAME_SIZE);
        soundFile[MAX_FILENAME_SIZE]=0;
        fp = fopen(soundFile, "rb");
        if (fp) {
            buffer_l = 1024;
            int extra = buffer_l % 5;
            buffer_l -= extra;
            buffer = (short *) hmalloc(buffer_l * sizeof(short) * channels);
        } else {
            strcpy(errorSoundDecoder, "Can't open raw file for read");
            return 0;
        }
        break;
#ifdef HAVE_PULSEAUDIO
    case DRIVER_PULSE:
        if((pa_dev = pulseaudio_initialize(channels, NULL)) == NULL){
            pa_dev=NULL;
            strcpy(errorSoundDecoder, "Can't initialize pulse audio");
            return 0;
        } else {
            buffer_l = 1024;
            int extra = buffer_l % 5;
            buffer_l -= extra;
            buffer = (short *) hmalloc(buffer_l * sizeof(short) * channels);
        }
        break;
#endif
#ifdef HAVE_ALSA
    case DRIVER_ALSA:
        if (snd_pcm_open(&pcm, (_alsaDevice != NULL ? _alsaDevice : "default"), SND_PCM_STREAM_CAPTURE, 0) < 0 ) {
            strcpy(errorSoundDecoder, "Can't open default capture device");
            return 0;
        } else {
            if (input_initialize(pcm, &buffer, &buffer_l, channels, errorSoundDecoder) < 0) return 0;
        }
        break;
#endif
#ifdef WIN32
    case DRIVER_WINMM:
        buffer_l = 4096;
        int buffer_len_in_bytes = buffer_l * sizeof(short) * channels;
        buffer = (short *) hmalloc(buffer_len_in_bytes);
        if (!winmm_init(deviceId, &winmm_device, channels, buffer_len_in_bytes, &winmm_event)) {
            strcpy(errorSoundDecoder, "Can't initialize windows audio");
            return 0;
        }
        break;
#endif
    }

    if (sound_channels == SOUND_CHANNELS_MONO) {
        rx_a = init_receiver('A', 1, 0);
    } else {
        rx_a = init_receiver('A', 2, 0);
        rx_b = init_receiver('B', 2, 1);
    }
    return 1;
}